

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read_header_format(p_ply ply)

{
  int iVar1;
  e_ply_storage_mode eVar2;
  char **in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  e_ply_storage_mode in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = strcmp(in_RDI[0x40b] + (long)in_RDI + 0x4c,"format");
  if (iVar1 == 0) {
    iVar1 = ply_read_word((p_ply)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = ply_find_string((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI);
      *(int *)((long)in_RDI + 4) = iVar1;
      if (*(int *)((long)in_RDI + 4) == -1) {
        iVar1 = 0;
      }
      else {
        if (*(int *)((long)in_RDI + 4) == 2) {
          in_RDI[0x40d] = (anonymous_namespace)::ply_idriver_ascii;
        }
        else {
          in_stack_ffffffffffffffec = *(e_ply_storage_mode *)((long)in_RDI + 4);
          eVar2 = ply_arch_endian();
          if (in_stack_ffffffffffffffec == eVar2) {
            in_RDI[0x40d] = (anonymous_namespace)::ply_idriver_binary;
          }
          else {
            in_RDI[0x40d] = (anonymous_namespace)::ply_idriver_binary_reverse;
          }
        }
        iVar1 = ply_read_word((p_ply)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          iVar1 = strcmp(in_RDI[0x40b] + (long)in_RDI + 0x4c,"1.0");
          if (iVar1 == 0) {
            iVar1 = ply_read_word((p_ply)CONCAT44(in_stack_ffffffffffffffec,
                                                  in_stack_ffffffffffffffe8));
            if (iVar1 == 0) {
              iVar1 = 0;
            }
            else {
              iVar1 = 1;
            }
          }
          else {
            iVar1 = 0;
          }
        }
      }
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int ply_read_header_format(p_ply ply) {
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "format")) return 0;
    if (!ply_read_word(ply)) return 0;
    ply->storage_mode =
        (e_ply_storage_mode)ply_find_string(BWORD(ply), ply_storage_mode_list);
    if (ply->storage_mode == (e_ply_storage_mode)(-1)) return 0;
    if (ply->storage_mode == PLY_ASCII)
        ply->idriver = &ply_idriver_ascii;
    else if (ply->storage_mode == ply_arch_endian())
        ply->idriver = &ply_idriver_binary;
    else
        ply->idriver = &ply_idriver_binary_reverse;
    if (!ply_read_word(ply)) return 0;
    if (strcmp(BWORD(ply), "1.0")) return 0;
    if (!ply_read_word(ply)) return 0;
    return 1;
}